

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

cmGeneratorTarget * __thiscall
cmGeneratorExpressionDAGChecker::TopTarget(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *pcVar1;
  
  do {
    pcVar1 = this;
    this = pcVar1->Parent;
  } while (this != (cmGeneratorExpressionDAGChecker *)0x0);
  return pcVar1->Target;
}

Assistant:

cmGeneratorTarget const* cmGeneratorExpressionDAGChecker::TopTarget() const
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }
  return top->Target;
}